

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::negI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_00;
  long lVar1;
  Literal local_90;
  Literal local_78;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_60,this);
  lVar1 = 0;
  do {
    this_00 = (Literal *)(local_60 + lVar1);
    neg(&local_78,this_00);
    Literal(&local_90,&local_78);
    if (this_00 != &local_90) {
      ~Literal(this_00);
      Literal(this_00,&local_90);
    }
    ~Literal(&local_90);
    ~Literal(&local_78);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_60);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_60 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::negI64x2() const {
  return unary<2, &Literal::getLanesI64x2, &Literal::neg>(*this);
}